

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3Fts5ExprFirst(Fts5Expr *p,Fts5Index *pIdx,i64 iFirst,int bDesc)

{
  Fts5ExprNode *pNode;
  int iVar1;
  int iVar2;
  
  pNode = p->pRoot;
  p->pIndex = pIdx;
  p->bDesc = bDesc;
  iVar1 = fts5ExprNodeFirst(p,pNode);
  if (iVar1 != 0) goto LAB_001a1f9e;
  iVar1 = 0;
  if (pNode->bEof != 0) goto LAB_001a1f9e;
  iVar2 = fts5RowidCmp(p,pNode->iRowid,iFirst);
  if (-1 < iVar2) goto LAB_001a1f9e;
  iVar1 = 1;
  while( true ) {
    iVar1 = (*pNode->xNext)(p,pNode,iVar1,iFirst);
LAB_001a1f9e:
    if (pNode->bNomatch == 0) break;
    iVar1 = 0;
    iFirst = 0;
  }
  return iVar1;
}

Assistant:

static int sqlite3Fts5ExprFirst(Fts5Expr *p, Fts5Index *pIdx, i64 iFirst, int bDesc){
  Fts5ExprNode *pRoot = p->pRoot;
  int rc;                         /* Return code */

  p->pIndex = pIdx;
  p->bDesc = bDesc;
  rc = fts5ExprNodeFirst(p, pRoot);

  /* If not at EOF but the current rowid occurs earlier than iFirst in
  ** the iteration order, move to document iFirst or later. */
  if( rc==SQLITE_OK 
   && 0==pRoot->bEof 
   && fts5RowidCmp(p, pRoot->iRowid, iFirst)<0 
  ){
    rc = fts5ExprNodeNext(p, pRoot, 1, iFirst);
  }

  /* If the iterator is not at a real match, skip forward until it is. */
  while( pRoot->bNomatch ){
    assert( pRoot->bEof==0 && rc==SQLITE_OK );
    rc = fts5ExprNodeNext(p, pRoot, 0, 0);
  }
  return rc;
}